

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::DoubleAPFloat::fusedMultiplyAdd
          (DoubleAPFloat *this,DoubleAPFloat *Multiplicand,DoubleAPFloat *Addend,roundingMode RM)

{
  opStatus oVar1;
  APFloat Tmp;
  undefined1 local_b0 [8];
  IEEEFloat local_a8;
  APFloat local_90;
  undefined1 local_70 [8];
  IEEEFloat local_68;
  DoubleAPFloat local_50;
  DoubleAPFloat local_40;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt((DoubleAPFloat *)local_b0);
    IEEEFloat::IEEEFloat
              ((IEEEFloat *)(local_70 + 8),(fltSemantics *)semPPCDoubleDoubleLegacy,
               (APInt *)local_b0);
    APInt::~APInt((APInt *)local_b0);
    bitcastToAPInt(&local_40);
    IEEEFloat::IEEEFloat
              ((IEEEFloat *)(local_b0 + 8),(fltSemantics *)semPPCDoubleDoubleLegacy,
               (APInt *)&local_40);
    bitcastToAPInt(&local_50);
    IEEEFloat::IEEEFloat
              (&local_90.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_50);
    oVar1 = APFloat::fusedMultiplyAdd((APFloat *)local_70,(APFloat *)local_b0,&local_90,RM);
    APFloat::Storage::~Storage((Storage *)&local_90.U.IEEE);
    APInt::~APInt((APInt *)&local_50);
    APFloat::Storage::~Storage((Storage *)(local_b0 + 8));
    APInt::~APInt((APInt *)&local_40);
    APFloat::bitcastToAPInt(&local_90);
    DoubleAPFloat((DoubleAPFloat *)local_b0,(fltSemantics *)semPPCDoubleDouble,(APInt *)&local_90);
    operator=(this,(DoubleAPFloat *)local_b0);
    std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::~unique_ptr
              ((unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_> *)(local_b0 + 8))
    ;
    APInt::~APInt((APInt *)&local_90);
    APFloat::Storage::~Storage((Storage *)(local_70 + 8));
    return oVar1;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1048,
                "APFloat::opStatus llvm::detail::DoubleAPFloat::fusedMultiplyAdd(const DoubleAPFloat &, const DoubleAPFloat &, APFloat::roundingMode)"
               );
}

Assistant:

APFloat::opStatus
DoubleAPFloat::fusedMultiplyAdd(const DoubleAPFloat &Multiplicand,
                                const DoubleAPFloat &Addend,
                                APFloat::roundingMode RM) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  auto Ret = Tmp.fusedMultiplyAdd(
      APFloat(semPPCDoubleDoubleLegacy, Multiplicand.bitcastToAPInt()),
      APFloat(semPPCDoubleDoubleLegacy, Addend.bitcastToAPInt()), RM);
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}